

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void s_AddDefineFlag(string *flag,string *dflags)

{
  char local_62 [2];
  char *local_60;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  char local_4a [2];
  char *local_48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  char *local_28;
  iterator flagStart;
  size_type initSize;
  string *dflags_local;
  string *flag_local;
  
  flagStart._M_current = (char *)std::__cxx11::string::size();
  std::__cxx11::string::operator+=((string *)dflags,' ');
  std::__cxx11::string::operator+=((string *)dflags,(string *)flag);
  local_38._M_current = (char *)std::__cxx11::string::begin();
  local_30 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator+(&local_38,flagStart._M_current);
  local_40 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator+(&local_30,1);
  local_28 = local_40._M_current;
  local_48 = (char *)std::__cxx11::string::end();
  local_4a[1] = 10;
  local_4a[0] = ' ';
  std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            (local_40,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )local_48,local_4a + 1,local_4a);
  local_58._M_current = local_28;
  local_60 = (char *)std::__cxx11::string::end();
  local_62[1] = 0xd;
  local_62[0] = ' ';
  std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            (local_58,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )local_60,local_62 + 1,local_62);
  return;
}

Assistant:

static void s_AddDefineFlag(std::string const& flag, std::string& dflags)
{
  // remove any \n\r
  std::string::size_type initSize = dflags.size();
  dflags += ' ';
  dflags += flag;
  std::string::iterator flagStart = dflags.begin() + initSize + 1;
  std::replace(flagStart, dflags.end(), '\n', ' ');
  std::replace(flagStart, dflags.end(), '\r', ' ');
}